

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuitPlayCapability.cpp
# Opt level: O1

vector<Card,_std::allocator<Card>_> * __thiscall
SuitPlayCapability::get_possible_player_cards
          (vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,SuitPlayCapability *this,
          vector<Card,_std::allocator<Card>_> *unknown_cards)

{
  pointer *ppCVar1;
  Card *pCVar2;
  iterator iVar3;
  int iVar4;
  Card *card;
  Card *this_00;
  
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar2 = (unknown_cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (unknown_cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pCVar2; this_00 = this_00 + 1) {
    if ((this->m_can_play_spades == true) && (iVar4 = Card::get_suit(this_00), iVar4 == 0)) {
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                  ((vector<Card,std::allocator<Card>> *)__return_storage_ptr__,iVar3,this_00);
      }
      else {
        *iVar3._M_current = *this_00;
        ppCVar1 = &(__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
    }
    if ((this->m_can_play_hearts == true) && (iVar4 = Card::get_suit(this_00), iVar4 == 1)) {
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                  ((vector<Card,std::allocator<Card>> *)__return_storage_ptr__,iVar3,this_00);
      }
      else {
        *iVar3._M_current = *this_00;
        ppCVar1 = &(__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
    }
    if ((this->m_can_play_diamonds == true) && (iVar4 = Card::get_suit(this_00), iVar4 == 2)) {
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                  ((vector<Card,std::allocator<Card>> *)__return_storage_ptr__,iVar3,this_00);
      }
      else {
        *iVar3._M_current = *this_00;
        ppCVar1 = &(__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
    }
    if ((this->m_can_play_clubs == true) && (iVar4 = Card::get_suit(this_00), iVar4 == 3)) {
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                  ((vector<Card,std::allocator<Card>> *)__return_storage_ptr__,iVar3,this_00);
      }
      else {
        *iVar3._M_current = *this_00;
        ppCVar1 = &(__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card> SuitPlayCapability::get_possible_player_cards(std::vector<Card> unknown_cards)
{
    std::vector<Card> possible_cards;

    for(auto const &card : unknown_cards) {
        if(m_can_play_spades && card.get_suit() == 0) {
            possible_cards.push_back(card);
        }
        if(m_can_play_hearts && card.get_suit() == 1) {
            possible_cards.push_back(card);
        }
        if(m_can_play_diamonds && card.get_suit() == 2) {
            possible_cards.push_back(card);
        }
        if(m_can_play_clubs && card.get_suit() == 3) {
            possible_cards.push_back(card);
        }
    }

    return possible_cards;
}